

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_read_siz_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  opj_image_t *poVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  opj_image_comp_t *poVar7;
  opj_tcp_v2_t *__s;
  opj_tccp_t *poVar8;
  opj_mct_data_t *poVar9;
  opj_simple_mcc_decorrelation_data_t *poVar10;
  long lVar11;
  uint uVar12;
  char *fmt;
  ulong __nmemb;
  size_t __size;
  OPJ_UINT32 *pOVar13;
  uint uVar14;
  uint uVar15;
  OPJ_BYTE *p_buffer;
  uint uVar16;
  long lVar17;
  opj_tccp_t **ppoVar18;
  bool bVar19;
  OPJ_UINT32 tmp;
  opj_image_t *local_60;
  opj_event_mgr *local_58;
  OPJ_UINT32 l_tmp;
  opj_cp_v2 *local_48;
  OPJ_UINT32 *local_40;
  OPJ_UINT32 *local_38;
  
  if (p_header_size < 0x24) {
    fmt = "Error with SIZ marker size\n";
  }
  else {
    __nmemb = (ulong)(p_header_size - 0x24) / 3;
    if ((p_header_size - 0x24) % 3 == 0) {
      poVar4 = p_j2k->m_private_image;
      opj_read_bytes_LE(p_header_data,&l_tmp,2);
      (p_j2k->m_cp).rsiz = l_tmp;
      local_40 = &poVar4->x1;
      opj_read_bytes_LE(p_header_data + 2,local_40,4);
      local_38 = &poVar4->y1;
      opj_read_bytes_LE(p_header_data + 6,local_38,4);
      opj_read_bytes_LE(p_header_data + 10,&poVar4->x0,4);
      opj_read_bytes_LE(p_header_data + 0xe,&poVar4->y0,4);
      opj_read_bytes_LE(p_header_data + 0x12,&(p_j2k->m_cp).tdx,4);
      opj_read_bytes_LE(p_header_data + 0x16,&(p_j2k->m_cp).tdy,4);
      opj_read_bytes_LE(p_header_data + 0x1a,&(p_j2k->m_cp).tx0,4);
      opj_read_bytes_LE(p_header_data + 0x1e,&(p_j2k->m_cp).ty0,4);
      opj_read_bytes_LE(p_header_data + 0x22,&l_tmp,2);
      if (0x4000 < l_tmp) {
        opj_event_msg_v2(p_manager,1,"Error with SIZ marker: number of component is illegal -> %d\n"
                        );
        return 0;
      }
      poVar4->numcomps = l_tmp;
      if (l_tmp != (OPJ_UINT32)__nmemb) {
        opj_event_msg_v2(p_manager,1,
                         "Error with SIZ marker: number of component is not compatible with the remaining number of parameters ( %d vs %d)\n"
                         ,(ulong)l_tmp,__nmemb);
        return 0;
      }
      poVar7 = (opj_image_comp_t *)calloc(__nmemb,0x38);
      poVar4->comps = poVar7;
      if (poVar7 == (opj_image_comp_t *)0x0) {
        poVar4->numcomps = 0;
      }
      else {
        local_48 = &p_j2k->m_cp;
        p_buffer = p_header_data + 0x24;
        pOVar13 = &poVar7->factor;
        local_60 = poVar4;
        local_58 = p_manager;
        for (uVar16 = 0; p_manager = local_58, poVar4 = local_60, uVar16 < (uint)__nmemb;
            uVar16 = uVar16 + 1) {
          opj_read_bytes_LE(p_buffer,&tmp,1);
          pOVar13[-4] = (tmp & 0x7f) + 1;
          pOVar13[-2] = tmp >> 7;
          opj_read_bytes_LE(p_buffer + 1,&tmp,1);
          ((opj_image_comp_t *)(pOVar13 + -10))->dx = tmp;
          opj_read_bytes_LE(p_buffer + 2,&tmp,1);
          pOVar13[-9] = tmp;
          pOVar13[-1] = 0;
          *pOVar13 = (p_j2k->m_cp).m_specific_param.m_dec.m_reduce;
          __nmemb = (ulong)local_60->numcomps;
          pOVar13 = pOVar13 + 0xe;
          p_buffer = p_buffer + 3;
        }
        uVar16 = (p_j2k->m_cp).tx0;
        uVar1 = (p_j2k->m_cp).ty0;
        uVar2 = (p_j2k->m_cp).tdx;
        uVar12 = ~uVar16;
        OVar5 = (int)(*local_40 + uVar12 + uVar2) / (int)uVar2;
        (p_j2k->m_cp).tw = OVar5;
        uVar3 = (p_j2k->m_cp).tdy;
        uVar14 = ~uVar1;
        OVar6 = (int)(*local_38 + uVar14 + uVar3) / (int)uVar3;
        (p_j2k->m_cp).th = OVar6;
        uVar15 = OVar6 * OVar5;
        if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 2) == 0) {
          *(undefined8 *)((long)&p_j2k->m_specific_param + 0x20) = 0;
          (p_j2k->m_specific_param).m_decoder.m_end_tile_x = OVar5;
        }
        else {
          (p_j2k->m_specific_param).m_decoder.m_start_tile_x =
               ((p_j2k->m_specific_param).m_decoder.m_start_tile_x - uVar16) / uVar2;
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y =
               ((p_j2k->m_specific_param).m_decoder.m_start_tile_y - uVar1) / uVar3;
          (p_j2k->m_specific_param).m_decoder.m_end_tile_x =
               (int)(uVar12 + uVar2 + (p_j2k->m_specific_param).m_decoder.m_end_tile_x) / (int)uVar2
          ;
          OVar6 = (int)(uVar14 + uVar3 + (p_j2k->m_specific_param).m_decoder.m_end_tile_y) /
                  (int)uVar3;
        }
        (p_j2k->m_specific_param).m_decoder.m_end_tile_y = OVar6;
        __s = (opj_tcp_v2_t *)calloc((ulong)uVar15,0x1630);
        (p_j2k->m_cp).tcps = __s;
        if (__s != (opj_tcp_v2_t *)0x0) {
          memset(__s,0,(ulong)uVar15 * 0x15e8);
          uVar16 = poVar4->numcomps;
          poVar8 = (opj_tccp_t *)calloc((ulong)uVar16,0x438);
          ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->tccps = poVar8;
          poVar8 = ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->tccps;
          if (poVar8 != (opj_tccp_t *)0x0) {
            memset(poVar8,0,(ulong)uVar16 * 0x438);
            poVar9 = (opj_mct_data_t *)malloc(0x140);
            ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mct_records = poVar9;
            poVar9 = ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mct_records;
            if (poVar9 != (opj_mct_data_t *)0x0) {
              memset(poVar9,0,0x140);
              ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_nb_max_mct_records = 10;
              poVar10 = (opj_simple_mcc_decorrelation_data_t *)malloc(0x140);
              ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mcc_records = poVar10;
              poVar10 = ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mcc_records;
              if (poVar10 != (opj_simple_mcc_decorrelation_data_t *)0x0) {
                memset(poVar10,0,0x140);
                ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_nb_max_mcc_records = 10;
                __size = (ulong)poVar4->numcomps * 0x438;
                lVar11 = 0x20;
                for (lVar17 = 0; __size - lVar17 != 0; lVar17 = lVar17 + 0x438) {
                  if (*(int *)((long)&poVar4->comps->dx + lVar11) == 0) {
                    *(int *)((long)&((p_j2k->m_specific_param).m_decoder.m_default_tcp)->tccps->
                                    m_dc_level_shift + lVar17) =
                         1 << (*(char *)((long)poVar4->comps + lVar11 + -8) - 1U & 0x1f);
                  }
                  lVar11 = lVar11 + 0x38;
                }
                ppoVar18 = &((p_j2k->m_cp).tcps)->tccps;
                while( true ) {
                  bVar19 = uVar15 == 0;
                  uVar15 = uVar15 - 1;
                  if (bVar19) {
                    (p_j2k->m_specific_param).m_decoder.m_state = 4;
                    opj_image_comp_header_update(local_60,local_48);
                    return 1;
                  }
                  poVar8 = (opj_tccp_t *)calloc(1,__size);
                  *ppoVar18 = poVar8;
                  if (poVar8 == (opj_tccp_t *)0x0) break;
                  ppoVar18 = ppoVar18 + 0x2c6;
                }
                fmt = "Not enough memory to take in charge SIZ marker\n";
                p_manager = local_58;
                goto LAB_0011d649;
              }
            }
          }
          fmt = "Not enough memory to take in charge SIZ marker\n";
          goto LAB_0011d649;
        }
      }
      fmt = "Not enough memory to take in charge SIZ marker\n";
    }
    else {
      fmt = "Error with SIZ marker size\n";
    }
  }
LAB_0011d649:
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

opj_bool j2k_read_siz_v2 (
				    opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	OPJ_UINT32 l_size, i;
	OPJ_UINT32 l_nb_comp;
	OPJ_UINT32 l_nb_comp_remain;
	OPJ_UINT32 l_remaining_size;
	OPJ_UINT32 l_nb_tiles;
	OPJ_UINT32 l_tmp;
	opj_image_t *l_image = 00;
	opj_cp_v2_t *l_cp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_tcp_v2_t * l_current_tile_param = 00;

	/* preconditions */
	assert(p_j2k != 00);
	assert(p_manager != 00);
	assert(p_header_data != 00);

	l_image = p_j2k->m_private_image;
	l_cp = &(p_j2k->m_cp);

	/* minimum size == 39 - 3 (= minimum component parameter) */
	if (p_header_size < 36) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker size\n");
		return OPJ_FALSE;
	}

	l_remaining_size = p_header_size - 36;
	l_nb_comp = l_remaining_size / 3;
	l_nb_comp_remain = l_remaining_size % 3;
	if (l_nb_comp_remain != 0){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker size\n");
		return OPJ_FALSE;
	}

	l_size = p_header_size + 2;										/* Lsiz */

	opj_read_bytes(p_header_data,&l_tmp ,2);						/* Rsiz (capabilities) */
	p_header_data+=2;
	l_cp->rsiz = (OPJ_RSIZ_CAPABILITIES) l_tmp;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->x1, 4);	/* Xsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->y1, 4);	/* Ysiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->x0, 4);	/* X0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->y0, 4);	/* Y0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tdx, 4);		/* XTsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tdy, 4);		/* YTsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tx0, 4);		/* XT0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->ty0, 4);		/* YT0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_tmp, 2);			/* Csiz */
	p_header_data+=2;
	if (l_tmp < 16385)
		l_image->numcomps = (OPJ_UINT16) l_tmp;
	else {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker: number of component is illegal -> %d\n", l_tmp);
		return OPJ_FALSE;
	}

	if (l_image->numcomps != l_nb_comp) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker: number of component is not compatible with the remaining number of parameters ( %d vs %d)\n", l_image->numcomps, l_nb_comp);
		return OPJ_FALSE;
	}

#ifdef USE_JPWL
	if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
		  too much the SIZ parameters */
		if (!(l_image->x1 * l_image->y1)) {
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"JPWL: bad image size (%d x %d)\n",
				l_image->x1, l_image->y1);
			if (!JPWL_ASSUME || JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
		}

	/* FIXME check previously in the function so why keep this piece of code ? Need by the norm ?
		if (l_image->numcomps != ((len - 38) / 3)) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: Csiz is %d => space in SIZ only for %d comps.!!!\n",
				l_image->numcomps, ((len - 38) / 3));
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
	*/		/* we try to correct */
	/*		opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust this\n");
			if (l_image->numcomps < ((len - 38) / 3)) {
				len = 38 + 3 * l_image->numcomps;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting Lsiz to %d => HYPOTHESIS!!!\n",
					len);
			} else {
				l_image->numcomps = ((len - 38) / 3);
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting Csiz to %d => HYPOTHESIS!!!\n",
					l_image->numcomps);
			}
		}
	*/

		/* update components number in the jpwl_exp_comps filed */
		l_cp->exp_comps = l_image->numcomps;
	}
#endif /* USE_JPWL */

	/* Allocate the resulting image components */
	l_image->comps = (opj_image_comp_t*) opj_calloc(l_image->numcomps, sizeof(opj_image_comp_t));
	if (l_image->comps == 00){
		l_image->numcomps = 0;
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}

	memset(l_image->comps,0,l_image->numcomps * sizeof(opj_image_comp_t));
	l_img_comp = l_image->comps;

	/* Read the component information */
	for (i = 0; i < l_image->numcomps; ++i){
		OPJ_UINT32 tmp;
		opj_read_bytes(p_header_data,&tmp,1);	/* Ssiz_i */
		++p_header_data;
		l_img_comp->prec = (tmp & 0x7f) + 1;
		l_img_comp->sgnd = tmp >> 7;
		opj_read_bytes(p_header_data,&tmp,1);	/* XRsiz_i */
		++p_header_data;
		l_img_comp->dx = (OPJ_INT32)tmp; /* should be between 1 and 255 */
		opj_read_bytes(p_header_data,&tmp,1);	/* YRsiz_i */
		++p_header_data;
		l_img_comp->dy = (OPJ_INT32)tmp; /* should be between 1 and 255 */

#ifdef USE_JPWL
		if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
			too much the SIZ parameters, again */
			if (!(l_image->comps[i].dx * l_image->comps[i].dy)) {
				opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
					"JPWL: bad XRsiz_%d/YRsiz_%d (%d x %d)\n",
					i, i, l_image->comps[i].dx, l_image->comps[i].dy);
				if (!JPWL_ASSUME) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
					return OPJ_FALSE;
				}
				/* we try to correct */
				opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust them\n");
				if (!l_image->comps[i].dx) {
					l_image->comps[i].dx = 1;
					opj_event_msg_v2(p_manager, EVT_WARNING, "- setting XRsiz_%d to %d => HYPOTHESIS!!!\n",
						i, l_image->comps[i].dx);
				}
				if (!l_image->comps[i].dy) {
					l_image->comps[i].dy = 1;
					opj_event_msg_v2(p_manager, EVT_WARNING, "- setting YRsiz_%d to %d => HYPOTHESIS!!!\n",
						i, l_image->comps[i].dy);
				}
			}
		}
#endif /* USE_JPWL */
		l_img_comp->resno_decoded = 0;								/* number of resolution decoded */
		l_img_comp->factor = l_cp->m_specific_param.m_dec.m_reduce; /* reducing factor per component */
		++l_img_comp;
	}

	/* Compute the number of tiles */
	l_cp->tw = int_ceildiv(l_image->x1 - l_cp->tx0, l_cp->tdx);
	l_cp->th = int_ceildiv(l_image->y1 - l_cp->ty0, l_cp->tdy);
	l_nb_tiles = l_cp->tw * l_cp->th;

	/* Define the tiles which will be decoded */
	if (p_j2k->m_specific_param.m_decoder.m_discard_tiles) {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = (p_j2k->m_specific_param.m_decoder.m_start_tile_x - l_cp->tx0) / l_cp->tdx;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = (p_j2k->m_specific_param.m_decoder.m_start_tile_y - l_cp->ty0) / l_cp->tdy;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = int_ceildiv((p_j2k->m_specific_param.m_decoder.m_end_tile_x - l_cp->tx0), l_cp->tdx);
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = int_ceildiv((p_j2k->m_specific_param.m_decoder.m_end_tile_y - l_cp->ty0), l_cp->tdy);
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
	}

#ifdef USE_JPWL
	if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
		  too much the SIZ parameters */
		if ((l_cp->tw < 1) || (l_cp->th < 1) || (l_cp->tw > l_cp->max_tiles) || (l_cp->th > l_cp->max_tiles)) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: bad number of tiles (%d x %d)\n",
				l_cp->tw, l_cp->th);
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
			/* we try to correct */
			opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust them\n");
			if (l_cp->tw < 1) {
				l_cp->tw= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting %d tiles in x => HYPOTHESIS!!!\n",
						l_cp->tw);
			}
			if (l_cp->tw > l_cp->max_tiles) {
				l_cp->tw= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- too large x, increase expectance of %d\n"
					"- setting %d tiles in x => HYPOTHESIS!!!\n",
					l_cp->max_tiles, l_cp->tw);
			}
			if (l_cp->th < 1) {
				l_cp->th= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting %d tiles in y => HYPOTHESIS!!!\n",
						l_cp->th);
			}
			if (l_cp->th > l_cp->max_tiles) {
				l_cp->th= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- too large y, increase expectance of %d to continue\n",
					"- setting %d tiles in y => HYPOTHESIS!!!\n",
					l_cp->max_tiles, l_cp->th);
			}
		}
	}
#endif /* USE_JPWL */

	/* memory allocations */
	l_cp->tcps = (opj_tcp_v2_t*) opj_calloc(l_nb_tiles, sizeof(opj_tcp_v2_t));
	if (l_cp->tcps == 00) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(l_cp->tcps,0,l_nb_tiles*sizeof(opj_tcp_t));

#ifdef USE_JPWL
	if (l_cp->correct) {
		if (!l_cp->tcps) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: could not alloc tcps field of cp\n");
			if (!JPWL_ASSUME || JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
		}
	}
#endif /* USE_JPWL */

	p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps =
			(opj_tccp_t*) opj_calloc(l_image->numcomps, sizeof(opj_tccp_t));
	if(p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps  == 00) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps ,0,l_image->numcomps*sizeof(opj_tccp_t));

	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records =
			(opj_mct_data_t*)opj_malloc(J2K_MCT_DEFAULT_NB_RECORDS * sizeof(opj_mct_data_t));

	if (! p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records,0,J2K_MCT_DEFAULT_NB_RECORDS * sizeof(opj_mct_data_t));
	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_nb_max_mct_records = J2K_MCT_DEFAULT_NB_RECORDS;

	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records =
			(opj_simple_mcc_decorrelation_data_t*)
			opj_malloc(J2K_MCC_DEFAULT_NB_RECORDS * sizeof(opj_simple_mcc_decorrelation_data_t));

	if (! p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records,0,J2K_MCC_DEFAULT_NB_RECORDS * sizeof(opj_simple_mcc_decorrelation_data_t));
	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_nb_max_mcc_records = J2K_MCC_DEFAULT_NB_RECORDS;

	/* set up default dc level shift */
	for (i=0;i<l_image->numcomps;++i) {
		if (! l_image->comps[i].sgnd) {
			p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps[i].m_dc_level_shift = 1 << (l_image->comps[i].prec - 1);
		}
	}

	l_current_tile_param = l_cp->tcps;
	for	(i = 0; i < l_nb_tiles; ++i) {
		l_current_tile_param->tccps = (opj_tccp_t*) opj_malloc(l_image->numcomps * sizeof(opj_tccp_t));
		if (l_current_tile_param->tccps == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
			return OPJ_FALSE;
		}
		memset(l_current_tile_param->tccps,0,l_image->numcomps * sizeof(opj_tccp_t));

		++l_current_tile_param;
	}

	p_j2k->m_specific_param.m_decoder.m_state =  J2K_STATE_MH; /* FIXME J2K_DEC_STATE_MH; */
	opj_image_comp_header_update(l_image,l_cp);

	return OPJ_TRUE;
}